

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_tools.cpp
# Opt level: O0

void __thiscall miniros::network::HttpFrame::finishReqeust(HttpFrame *this)

{
  int iVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ulong uVar3;
  HttpFrame *in_RDI;
  string newData;
  size_t currentLength;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  allocator local_31;
  string local_30 [32];
  long local_10;
  
  if (in_RDI->m_state == ParseComplete) {
    local_10 = (long)in_RDI->m_bodyPosition;
    if (-1 < in_RDI->m_contentLength) {
      local_10 = in_RDI->m_contentLength + local_10;
    }
    iVar1 = in_RDI->m_contentLength;
    lVar2 = std::__cxx11::string::size();
    if (iVar1 == lVar2) {
      std::__cxx11::string::clear();
    }
    else {
      lVar2 = std::__cxx11::string::data();
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (lVar2 + local_10);
      lVar2 = std::__cxx11::string::size();
      uVar3 = lVar2 - local_10;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_30,(char *)__lhs,uVar3,&local_31);
      std::allocator<char>::~allocator((allocator<char> *)&local_31);
      std::swap<char,std::char_traits<char>,std::allocator<char>>(__lhs,in_stack_ffffffffffffff88);
      std::__cxx11::string::~string(local_30);
    }
  }
  else {
    std::__cxx11::string::clear();
  }
  resetParseState(in_RDI);
  return;
}

Assistant:

void HttpFrame::finishReqeust()
{
  if (m_state == ParseComplete) {
    size_t currentLength = m_bodyPosition;
    if (m_contentLength >= 0)
      currentLength += m_contentLength;
    if (m_contentLength  == data.size()) {
      data.clear();
    } else {
      // Truncate all data related to current request
      std::string newData(data.data() + currentLength, data.size() - currentLength);
      std::swap(data, newData);
    }
  } else {
    data.clear();
  }
  resetParseState();
}